

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ugen.c
# Opt level: O2

void ugen_done_graph(_dspcontext *dc)

{
  int downsample;
  int upsample;
  int iVar1;
  _ugenbox *p_Var2;
  _vinlet *x;
  t_pd p_Var3;
  t_ugenbox *u;
  _sigoutconnect *p_Var4;
  _instanceugen *p_Var5;
  uint uVar6;
  char *pcVar7;
  t_object *ptVar8;
  ulong uVar9;
  t_signal *sig2;
  t_signal **parentsigs;
  _dspcontext *p_Var10;
  t_signal *ptVar11;
  int *piVar12;
  t_signal **pptVar13;
  _siginlet *p_Var14;
  int iVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  t_sigoutconnect *fatso;
  int myvecsize;
  _dspcontext *p_Var19;
  _sigoutlet *p_Var20;
  int iVar21;
  long lVar22;
  _sigoutlet *p_Var23;
  t_object *object;
  bool bVar24;
  bool bVar25;
  t_float tVar26;
  t_float local_7c;
  int local_78;
  int local_6c;
  int local_48;
  int local_40;
  
  p_Var10 = dc->dc_parentcontext;
  if (*(int *)(pd_maininstance.pd_ugen + 0x134) != 0) {
    post("ugen_done_graph...");
    p_Var19 = dc;
    while (p_Var2 = p_Var19->dc_ugenlist, p_Var2 != (_ugenbox *)0x0) {
      class_getname((p_Var2->u_obj->te_g).g_pd);
      post("ugen: %s");
      p_Var20 = p_Var2->u_out;
      for (uVar9 = 0; p_Var23 = p_Var20, (int)uVar9 < p_Var2->u_nout;
          uVar9 = (ulong)((int)uVar9 + 1)) {
        while (p_Var23 = (_sigoutlet *)p_Var23->o_connections, p_Var23 != (_sigoutlet *)0x0) {
          pcVar7 = class_getname((_class *)**(undefined8 **)(*(long *)p_Var23 + 0x28));
          uVar6 = ugen_index(dc,*(t_ugenbox **)p_Var23);
          post("... out %d to %s, index %d, inlet %d",uVar9,pcVar7,(ulong)uVar6,
               (ulong)*(uint *)&p_Var23->o_signal);
        }
        p_Var20 = p_Var20 + 1;
      }
      p_Var19 = (_dspcontext *)&p_Var2->u_next;
    }
  }
  p_Var19 = dc;
  object = (t_object *)0x0;
  while (p_Var2 = p_Var19->dc_ugenlist, p_Var2 != (_ugenbox *)0x0) {
    ptVar8 = object;
    if (((p_Var2->u_obj->te_g).g_pd == block_class) &&
       (ptVar8 = p_Var2->u_obj, object != (t_object *)0x0)) {
      pd_error(object,"conflicting block~ and/or switch~ objects in same window");
      ptVar8 = object;
    }
    object = ptVar8;
    p_Var19 = (_dspcontext *)&p_Var2->u_next;
  }
  if (p_Var10 == (_dspcontext *)0x0) {
    local_7c = sys_getsr();
    local_6c = sys_getblksize();
    tVar26 = local_7c;
    iVar16 = local_6c;
    if (object != (t_object *)0x0) goto LAB_0012cdf4;
  }
  else {
    local_7c = p_Var10->dc_srate;
    local_6c = p_Var10->dc_vecsize;
    if (object != (t_object *)0x0) {
LAB_0012cdf4:
      myvecsize = *(int *)&object[1].te_g.g_pd;
      if (myvecsize == 0) {
        myvecsize = local_6c;
      }
      iVar16 = *(int *)((long)&object[1].te_g.g_pd + 4);
      if (iVar16 == 0) {
        iVar16 = myvecsize;
      }
      iVar21 = *(int *)&object[1].te_g.g_next;
      if (myvecsize <= iVar21) {
        iVar21 = myvecsize;
      }
      downsample = *(int *)&object[2].te_g.g_pd;
      if (local_6c <= downsample) {
        downsample = local_6c;
      }
      upsample = *(int *)&object[1].te_width;
      local_48 = local_6c * upsample * iVar21;
      local_40 = (downsample * myvecsize) / local_48;
      local_48 = local_48 / (downsample * myvecsize);
      if (local_40 < 2) {
        local_40 = 1;
      }
      if (local_48 < 2) {
        local_48 = 1;
      }
      *(int *)((long)&object[1].te_binbuf + 4) = local_48;
      *(int *)&object[1].te_binbuf = local_40;
      *(uint *)((long)&object[1].te_g.g_next + 4) =
           local_40 - 1U & *(uint *)(pd_maininstance.pd_ugen + 0x130);
      if ((((p_Var10 == (_dspcontext *)0x0) || (iVar21 != 1)) || (upsample != 1)) ||
         ((myvecsize != local_6c || (uVar9 = 0, downsample != 1)))) {
        uVar9 = 1;
      }
      tVar26 = ((float)upsample * (float)iVar21 * local_7c) / (float)downsample;
      uVar18 = (ulong)(uint)(int)(char)object[1].te_xpix;
      bVar25 = false;
      goto LAB_0012cf1a;
    }
    tVar26 = local_7c;
    iVar16 = p_Var10->dc_calcsize;
  }
  uVar9 = (ulong)(p_Var10 == (_dspcontext *)0x0);
  uVar18 = 0;
  bVar25 = true;
  local_48 = 1;
  downsample = 1;
  local_40 = 1;
  upsample = 1;
  myvecsize = local_6c;
  local_7c = tVar26;
LAB_0012cf1a:
  dc->dc_reblock = (char)uVar9;
  dc->dc_switched = (char)uVar18;
  dc->dc_srate = tVar26;
  dc->dc_vecsize = myvecsize;
  dc->dc_calcsize = iVar16;
  pptVar13 = dc->dc_iosigs;
  iVar21 = (int)uVar18;
  local_78 = (int)uVar9;
  if ((pptVar13 != (t_signal **)0x0) && (iVar21 != 0 || local_78 != 0)) {
    iVar1 = dc->dc_ninlets;
    for (lVar17 = 0; (int)lVar17 < dc->dc_noutlets; lVar17 = lVar17 + 1) {
      ptVar11 = pptVar13[iVar1 + lVar17];
      if ((ptVar11->s_isborrowed != 0) && (ptVar11->s_borrowedfrom == (_signal *)0x0)) {
        sig2 = signal_new(local_6c,local_7c);
        signal_setborrowed(ptVar11,sig2);
        ptVar11 = pptVar13[iVar1 + lVar17];
        ptVar11->s_refcount = ptVar11->s_refcount + 1;
        if (*(int *)(pd_maininstance.pd_ugen + 0x134) != 0) {
          post("set %lx->%lx",ptVar11,ptVar11->s_borrowedfrom);
        }
      }
    }
  }
  p_Var10 = dc;
  if (*(int *)(pd_maininstance.pd_ugen + 0x134) != 0) {
    post("reblock %d, switched %d",uVar9,uVar18);
  }
  while (p_Var2 = p_Var10->dc_ugenlist, p_Var2 != (_ugenbox *)0x0) {
    pptVar13 = dc->dc_iosigs;
    if (pptVar13 == (t_signal **)0x0) {
      parentsigs = (t_signal **)0x0;
    }
    else {
      parentsigs = pptVar13 + dc->dc_ninlets;
    }
    x = (_vinlet *)p_Var2->u_obj;
    p_Var3 = (x->x_obj).te_g.g_pd;
    if (p_Var3 == vinlet_class) {
      vinlet_dspprolog(x,pptVar13,myvecsize,iVar16,*(int *)(pd_maininstance.pd_ugen + 0x130),
                       local_40,local_48,downsample,upsample,local_78,iVar21);
    }
    else if (p_Var3 == voutlet_class) {
      voutlet_dspprolog((_voutlet *)x,parentsigs,myvecsize,iVar16,
                        *(int *)(pd_maininstance.pd_ugen + 0x130),local_40,local_48,downsample,
                        upsample,local_78,iVar21);
    }
    p_Var10 = (_dspcontext *)&p_Var2->u_next;
  }
  iVar1 = *(int *)(pd_maininstance.pd_ugen + 8);
  p_Var10 = dc;
  if ((!bVar25) && (iVar21 != 0 || local_78 != 0)) {
    dsp_add(block_prolog,1,object);
    *(int *)((long)&object[1].te_outlet + 4) = *(int *)(pd_maininstance.pd_ugen + 8) + -1;
  }
  while (p_Var2 = p_Var10->dc_ugenlist, p_Var10 = dc, p_Var2 != (_ugenbox *)0x0) {
    p_Var2->u_done = 0;
    iVar15 = p_Var2->u_nout;
    piVar12 = &p_Var2->u_out->o_nsent;
    while (bVar24 = iVar15 != 0, iVar15 = iVar15 + -1, bVar24) {
      *piVar12 = 0;
      piVar12 = piVar12 + 6;
    }
    iVar15 = p_Var2->u_nin;
    pptVar13 = &p_Var2->u_in->i_signal;
    while (bVar24 = iVar15 != 0, iVar15 = iVar15 + -1, bVar24) {
      *(int *)((long)pptVar13 + -4) = 0;
      *pptVar13 = (t_signal *)0x0;
      pptVar13 = pptVar13 + 2;
    }
    p_Var10 = (_dspcontext *)&p_Var2->u_next;
  }
  while (u = p_Var10->dc_ugenlist, p_Var10 = dc, u != (t_ugenbox *)0x0) {
    if (u->u_done == 0) {
      p_Var14 = u->u_in;
      iVar15 = u->u_nin + 1;
      do {
        iVar15 = iVar15 + -1;
        if (iVar15 == 0) {
          ugen_doit(dc,u);
          break;
        }
        piVar12 = &p_Var14->i_nconnect;
        p_Var14 = p_Var14 + 1;
      } while (*piVar12 == 0);
    }
    p_Var10 = (_dspcontext *)&u->u_next;
  }
  while( true ) {
    p_Var2 = p_Var10->dc_ugenlist;
    if (p_Var2 == (_ugenbox *)0x0) goto LAB_0012d23c;
    if (p_Var2->u_done == 0) break;
    p_Var10 = (_dspcontext *)&p_Var2->u_next;
  }
  pd_error(p_Var2->u_obj,"DSP loop detected (some tilde objects not scheduled)");
  iVar15 = dc->dc_ninlets;
  pptVar13 = dc->dc_iosigs;
  for (lVar17 = 0; (int)lVar17 < dc->dc_noutlets; lVar17 = lVar17 + 1) {
    if ((pptVar13[iVar15 + lVar17]->s_isborrowed != 0) &&
       (pptVar13[iVar15 + lVar17]->s_borrowedfrom == (_signal *)0x0)) {
      ptVar11 = signal_new(local_6c,local_7c);
      signal_setborrowed(pptVar13[iVar15 + lVar17],ptVar11);
      pptVar13[iVar15 + lVar17]->s_refcount = pptVar13[iVar15 + lVar17]->s_refcount + 1;
      dsp_add_zero(ptVar11->s_vec,ptVar11->s_n);
      if (*(int *)(pd_maininstance.pd_ugen + 0x134) != 0) {
        post("oops, belatedly set %lx->%lx",pptVar13[iVar15 + lVar17],
             pptVar13[iVar15 + lVar17]->s_borrowedfrom);
      }
    }
  }
LAB_0012d23c:
  if ((!bVar25) && (iVar21 != 0 || local_78 != 0)) {
    dsp_add(block_epilog,1,object);
  }
  iVar15 = *(int *)(pd_maininstance.pd_ugen + 8);
  p_Var10 = dc;
  while (p_Var5 = pd_maininstance.pd_ugen, p_Var2 = p_Var10->dc_ugenlist, p_Var2 != (_ugenbox *)0x0)
  {
    if ((((_voutlet *)p_Var2->u_obj)->x_obj).te_g.g_pd == voutlet_class) {
      if (dc->dc_iosigs == (t_signal **)0x0) {
        pptVar13 = (t_signal **)0x0;
      }
      else {
        pptVar13 = dc->dc_iosigs + dc->dc_ninlets;
      }
      voutlet_dspepilog((_voutlet *)p_Var2->u_obj,pptVar13,myvecsize,iVar16,
                        *(int *)(pd_maininstance.pd_ugen + 0x130),local_40,local_48,downsample,
                        upsample,local_78,iVar21);
    }
    p_Var10 = (_dspcontext *)&p_Var2->u_next;
  }
  if (!bVar25) {
    iVar16 = *(int *)(pd_maininstance.pd_ugen + 8);
    *(int *)&object[1].te_inlet = iVar15 - iVar1;
    *(int *)((long)&object[1].te_inlet + 4) = iVar16 - iVar15;
    *(char *)&object[1].te_ypix = (char)uVar9;
  }
  if (*(int *)(p_Var5 + 0x134) != 0) {
    if (dc->dc_parentcontext == (_dspcontext *)0x0) {
      iVar16 = *(int *)(p_Var5 + 8);
      lVar17 = *(long *)p_Var5;
      for (lVar22 = 0; iVar16 != (int)lVar22; lVar22 = lVar22 + 1) {
        post("chain %lx",*(undefined8 *)(lVar17 + lVar22 * 8));
      }
    }
    post("... ugen_done_graph done.");
  }
  while (p_Var2 = dc->dc_ugenlist, p_Var2 != (_ugenbox *)0x0) {
    p_Var20 = p_Var2->u_out;
    iVar16 = p_Var2->u_nout;
    while (bVar25 = iVar16 != 0, iVar16 = iVar16 + -1, bVar25) {
      fatso = p_Var20->o_connections;
      while (fatso != (t_sigoutconnect *)0x0) {
        p_Var4 = fatso->oc_next;
        freebytes(fatso,0x18);
        fatso = p_Var4;
      }
      p_Var20 = p_Var20 + 1;
    }
    freebytes(dc->dc_ugenlist->u_out,(long)dc->dc_ugenlist->u_nout * 0x18);
    freebytes(dc->dc_ugenlist->u_in,(long)dc->dc_ugenlist->u_nin << 4);
    p_Var2 = dc->dc_ugenlist;
    dc->dc_ugenlist = p_Var2->u_next;
    freebytes(p_Var2,0x38);
  }
  if (*(_dspcontext **)(pd_maininstance.pd_ugen + 0x138) == dc) {
    *(_dspcontext **)(pd_maininstance.pd_ugen + 0x138) = dc->dc_parentcontext;
  }
  else {
    bug("THIS->u_context");
  }
  freebytes(dc,0x30);
  return;
}

Assistant:

void ugen_done_graph(t_dspcontext *dc)
{
    t_ugenbox *u;
    t_sigoutlet *uout;
    t_siginlet *uin;
    t_sigoutconnect *oc, *oc2;
    int i, n;
    t_block *blk;
    t_dspcontext *parent_context = dc->dc_parentcontext;
    t_float parent_srate;
    int parent_vecsize;
    int period, frequency, phase, vecsize, calcsize;
    t_float srate;
    int chainblockbegin;    /* DSP chain onset before block prolog code */
    int chainblockend;      /* and after block epilog code */
    int chainafterall;      /* and after signal outlet epilog */
    int reblock = 0, switched;
    int downsample = 1, upsample = 1;
    /* debugging printout */

    if (THIS->u_loud)
    {
        post("ugen_done_graph...");
        for (u = dc->dc_ugenlist; u; u = u->u_next)
        {
            post("ugen: %s", class_getname(u->u_obj->ob_pd));
            for (uout = u->u_out, i = 0; i < u->u_nout; uout++, i++)
                for (oc = uout->o_connections; oc; oc = oc->oc_next)
            {
                post("... out %d to %s, index %d, inlet %d", i,
                    class_getname(oc->oc_who->u_obj->ob_pd),
                        ugen_index(dc, oc->oc_who), oc->oc_inno);
            }
        }
    }

        /* search for an object of class "block~" */
    for (u = dc->dc_ugenlist, blk = 0; u; u = u->u_next)
    {
        t_pd *zz = &u->u_obj->ob_pd;
        if (pd_class(zz) == block_class)
        {
            if (blk)
                pd_error(blk, "conflicting block~ and/or switch~ objects in same window");
            else blk = (t_block *)zz;
        }
    }

        /* figure out block size, calling frequency, sample rate */
    if (parent_context)
    {
        parent_srate = parent_context->dc_srate;
        parent_vecsize = parent_context->dc_vecsize;
    }
    else
    {
        parent_srate = sys_getsr();
        parent_vecsize = sys_getblksize();
    }
    if (blk)
    {
        int realoverlap;
        vecsize = blk->x_vecsize;
        if (vecsize == 0)
            vecsize = parent_vecsize;
        calcsize = blk->x_calcsize;
        if (calcsize == 0)
            calcsize = vecsize;
        realoverlap = blk->x_overlap;
        if (realoverlap > vecsize) realoverlap = vecsize;
        downsample = blk->x_downsample;
        upsample   = blk->x_upsample;
        if (downsample > parent_vecsize)
            downsample = parent_vecsize;
        period = (vecsize * downsample)/
            (parent_vecsize * realoverlap * upsample);
        frequency = (parent_vecsize * realoverlap * upsample)/
            (vecsize * downsample);
        phase = blk->x_phase;
        srate = parent_srate * realoverlap * upsample / downsample;
        if (period < 1) period = 1;
        if (frequency < 1) frequency = 1;
        blk->x_frequency = frequency;
        blk->x_period = period;
        blk->x_phase = THIS->u_phase & (period - 1);
        if (! parent_context || (realoverlap != 1) ||
            (vecsize != parent_vecsize) ||
                (downsample != 1) || (upsample != 1))
                    reblock = 1;
        switched = blk->x_switched;
    }
    else
    {
        srate = parent_srate;
        vecsize = parent_vecsize;
        calcsize = (parent_context ? parent_context->dc_calcsize : vecsize);
        downsample = upsample = 1;
        period = frequency = 1;
        phase = 0;
        if (!parent_context) reblock = 1;
        switched = 0;
    }
    dc->dc_reblock = reblock;
    dc->dc_switched = switched;
    dc->dc_srate = srate;
    dc->dc_vecsize = vecsize;
    dc->dc_calcsize = calcsize;

        /* if we're reblocking or switched, we now have to create output
        signals to fill in for the "borrowed" ones we have now.  This
        is also possibly true even if we're not blocked/switched, in
        the case that there was a signal loop.  But we don't know this
        yet.  */

    if (dc->dc_iosigs && (switched || reblock))
    {
        t_signal **sigp;
        for (i = 0, sigp = dc->dc_iosigs + dc->dc_ninlets; i < dc->dc_noutlets;
            i++, sigp++)
        {
            if ((*sigp)->s_isborrowed && !(*sigp)->s_borrowedfrom)
            {
                signal_setborrowed(*sigp,
                    signal_new(parent_vecsize, parent_srate));
                (*sigp)->s_refcount++;

                if (THIS->u_loud) post("set %lx->%lx", *sigp,
                    (*sigp)->s_borrowedfrom);
            }
        }
    }

    if (THIS->u_loud)
        post("reblock %d, switched %d", reblock, switched);

        /* schedule prologs for inlets and outlets.  If the "reblock" flag
        is set, an inlet will put code on the DSP chain to copy its input
        into an internal buffer here, before any unit generators' DSP code
        gets scheduled.  If we don't "reblock", inlets will need to get
        pointers to their corresponding inlets/outlets on the box we're inside,
        if any.  Outlets will also need pointers, unless we're switched, in
        which case outlet epilog code will kick in. */

    for (u = dc->dc_ugenlist; u; u = u->u_next)
    {
        t_pd *zz = &u->u_obj->ob_pd;
        t_signal **outsigs = dc->dc_iosigs;
        if (outsigs) outsigs += dc->dc_ninlets;

        if (pd_class(zz) == vinlet_class)
            vinlet_dspprolog((struct _vinlet *)zz,
                dc->dc_iosigs, vecsize, calcsize, THIS->u_phase, period, frequency,
                    downsample, upsample, reblock, switched);
        else if (pd_class(zz) == voutlet_class)
            voutlet_dspprolog((struct _voutlet *)zz,
                outsigs, vecsize, calcsize, THIS->u_phase, period, frequency,
                    downsample, upsample, reblock, switched);
    }
    chainblockbegin = THIS->u_dspchainsize;

    if (blk && (reblock || switched))   /* add the block DSP prolog */
    {
        dsp_add(block_prolog, 1, blk);
        blk->x_chainonset = THIS->u_dspchainsize - 1;
    }
        /* Initialize for sorting */
    for (u = dc->dc_ugenlist; u; u = u->u_next)
    {
        u->u_done = 0;
        for (uout = u->u_out, i = u->u_nout; i--; uout++)
            uout->o_nsent = 0;
        for (uin = u->u_in, i = u->u_nin; i--; uin++)
            uin->i_ngot = 0, uin->i_signal = 0;
   }

        /* Do the sort */

    for (u = dc->dc_ugenlist; u; u = u->u_next)
    {
            /* check that we have no connected signal inlets */
        if (u->u_done) continue;
        for (uin = u->u_in, i = u->u_nin; i--; uin++)
            if (uin->i_nconnect) goto next;

        ugen_doit(dc, u);
    next: ;
    }

        /* check for a DSP loop, which is evidenced here by the presence
        of ugens not yet scheduled. */

    for (u = dc->dc_ugenlist; u; u = u->u_next)
        if (!u->u_done)
    {
        t_signal **sigp;
        pd_error(u->u_obj,
            "DSP loop detected (some tilde objects not scheduled)");
                /* this might imply that we have unfilled "borrowed" outputs
                which we'd better fill in now. */
        for (i = 0, sigp = dc->dc_iosigs + dc->dc_ninlets; i < dc->dc_noutlets;
            i++, sigp++)
        {
            if ((*sigp)->s_isborrowed && !(*sigp)->s_borrowedfrom)
            {
                t_signal *s3 = signal_new(parent_vecsize, parent_srate);
                signal_setborrowed(*sigp, s3);
                (*sigp)->s_refcount++;
                dsp_add_zero(s3->s_vec, s3->s_n);
                if (THIS->u_loud)
                    post("oops, belatedly set %lx->%lx", *sigp,
                        (*sigp)->s_borrowedfrom);
            }
        }
        break;   /* don't need to keep looking. */
    }

    if (blk && (reblock || switched))    /* add block DSP epilog */
        dsp_add(block_epilog, 1, blk);
    chainblockend = THIS->u_dspchainsize;

        /* add epilogs for outlets.  */

    for (u = dc->dc_ugenlist; u; u = u->u_next)
    {
        t_pd *zz = &u->u_obj->ob_pd;
        if (pd_class(zz) == voutlet_class)
        {
            t_signal **iosigs = dc->dc_iosigs;
            if (iosigs) iosigs += dc->dc_ninlets;
            voutlet_dspepilog((struct _voutlet *)zz,
                iosigs, vecsize, calcsize, THIS->u_phase, period, frequency,
                    downsample, upsample, reblock, switched);
        }
    }

    chainafterall = THIS->u_dspchainsize;
    if (blk)
    {
        blk->x_blocklength = chainblockend - chainblockbegin;
        blk->x_epiloglength = chainafterall - chainblockend;
        blk->x_reblock = reblock;
    }

    if (THIS->u_loud)
    {
        t_int *ip;
        if (!dc->dc_parentcontext)
            for (i = THIS->u_dspchainsize, ip = THIS->u_dspchain;
                i--; ip++)
                    post("chain %lx", *ip);
        post("... ugen_done_graph done.");
    }
        /* now delete everything. */
    while (dc->dc_ugenlist)
    {
        for (uout = dc->dc_ugenlist->u_out, n = dc->dc_ugenlist->u_nout;
            n--; uout++)
        {
            oc = uout->o_connections;
            while (oc)
            {
                oc2 = oc->oc_next;
                freebytes(oc, sizeof *oc);
                oc = oc2;
            }
        }
        freebytes(dc->dc_ugenlist->u_out, dc->dc_ugenlist->u_nout *
            sizeof (*dc->dc_ugenlist->u_out));
        freebytes(dc->dc_ugenlist->u_in, dc->dc_ugenlist->u_nin *
            sizeof(*dc->dc_ugenlist->u_in));
        u = dc->dc_ugenlist;
        dc->dc_ugenlist = u->u_next;
        freebytes(u, sizeof *u);
    }
    if (THIS->u_context == dc)
        THIS->u_context = dc->dc_parentcontext;
    else bug("THIS->u_context");
    freebytes(dc, sizeof(*dc));

}